

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::vector<unsigned_char>_>::push_back
          (vector<crnlib::vector<unsigned_char>_> *this,vector<unsigned_char> *obj)

{
  vector<unsigned_char> *pvVar1;
  uint uVar2;
  vector<unsigned_char> *pvVar3;
  uint uVar4;
  
  uVar4 = this->m_size;
  if (this->m_capacity <= uVar4) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,uVar4 + 1,true,0x10,(object_mover)0x0,false);
    uVar4 = this->m_size;
  }
  pvVar3 = this->m_p;
  pvVar1 = pvVar3 + uVar4;
  pvVar1->m_p = (uchar *)0x0;
  pvVar1->m_size = 0;
  pvVar1->m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)(pvVar3 + uVar4),obj->m_size,false,1,(object_mover)0x0,false);
  uVar2 = obj->m_size;
  pvVar3[uVar4].m_size = uVar2;
  memcpy(pvVar3[uVar4].m_p,obj->m_p,(ulong)uVar2);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void push_back(const T& obj)
        {
            CRNLIB_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

            if (m_size >= m_capacity)
            {
                increase_capacity(m_size + 1, true);
            }

            scalar_type<T>::construct(m_p + m_size, obj);
            m_size++;
        }